

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmxreftobin.cpp
# Opt level: O2

void fmxreftobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  fmXref q;
  char line [4096];
  
  fgets(line,0x1000,_stdin);
  uVar3 = 1;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%d,%d,%d",&q,&q.agg_id,&q.layer_id);
    if (iVar1 != 3) break;
    fwrite(&q,0xc,1,_stdout);
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,line);
  return;
}

Assistant:

void doit() {

        fmXref q;
        char line[4096];
        int lineno = 0;
        fgets(line, sizeof(line), stdin);
        lineno++;
        while (fgets(line, sizeof(line), stdin) != 0) {
            if (sscanf(line, "%d,%d,%d", &q.output_id, &q.agg_id,
                       &q.layer_id) != 3) {
                fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
                return;
            } else {
                fwrite(&q, sizeof(q), 1, stdout);
            }
            lineno++;
        }
    }